

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileExporter.cpp
# Opt level: O2

void __thiscall
Assimp::XFileExporter::XFileExporter
          (XFileExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file,
          ExportProperties *pProperties)

{
  allocator<char> aaStack_48 [8];
  stringstream *local_40;
  locale local_38 [8];
  
  this->_vptr_XFileExporter = (_func_int **)&PTR__XFileExporter_008df958;
  local_40 = &this->mOutput;
  std::__cxx11::stringstream::stringstream((stringstream *)local_40);
  this->mProperties = pProperties;
  this->mIOSystem = pIOSystem;
  std::__cxx11::string::string((string *)&this->mPath,(string *)path);
  std::__cxx11::string::string((string *)&this->mFile,(string *)file);
  this->mScene = pScene;
  this->mSceneOwned = false;
  (this->startstr)._M_dataplus._M_p = (pointer)&(this->startstr).field_2;
  (this->startstr)._M_string_length = 0;
  (this->startstr).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->endstr,"\n",aaStack_48);
  std::locale::locale((locale *)aaStack_48,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale((locale *)aaStack_48);
  *(undefined8 *)(&this->field_0x10 + *(long *)(*(long *)&this->mOutput + -0x18)) = 8;
  WriteFile(this);
  return;
}

Assistant:

XFileExporter::XFileExporter(const aiScene* pScene, IOSystem* pIOSystem, const std::string& path, const std::string& file, const ExportProperties* pProperties)
        : mProperties(pProperties),
        mIOSystem(pIOSystem),
        mPath(path),
        mFile(file),
        mScene(pScene),
        mSceneOwned(false),
        endstr("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue( std::locale("C") );
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // start writing
    WriteFile();
}